

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprintpreviewdialog.cpp
# Opt level: O0

void __thiscall QPrintPreviewDialogPrivate::setupActions(QPrintPreviewDialogPrivate *this)

{
  QLatin1StringView str;
  QLatin1StringView str_00;
  QLatin1StringView str_01;
  QLatin1StringView str_02;
  QLatin1StringView name;
  QLatin1StringView name_00;
  QLatin1StringView name_01;
  QLatin1StringView name_02;
  QLatin1StringView name_03;
  QLatin1StringView name_04;
  QLatin1StringView name_05;
  QLatin1StringView name_06;
  QLatin1StringView name_07;
  QLatin1StringView name_08;
  QLatin1StringView name_09;
  QLatin1StringView name_10;
  QLatin1StringView name_11;
  QLatin1StringView name_12;
  QLatin1StringView name_13;
  Orientation OVar1;
  QObject *pQVar2;
  QActionGroup *pQVar3;
  QAction *pQVar4;
  QActionGroup *pQVar5;
  QAction *pQVar6;
  QActionGroup *pQVar7;
  QPrintPreviewDialogPrivate *in_RDI;
  long in_FS_OFFSET;
  QLatin1StringView QVar8;
  QPrintPreviewDialog *q;
  QAnyStringView *this_00;
  QActionGroup *this_01;
  QAction *in_stack_fffffffffffffbc8;
  qsizetype in_stack_fffffffffffffcd0;
  char *pcVar9;
  char *in_stack_fffffffffffffcd8;
  char *pcVar10;
  QObject local_1f8 [8];
  QObject local_1f0 [8];
  char local_1e8 [24];
  char local_1d0 [24];
  QObject local_1b8 [56];
  char local_180 [24];
  char local_168 [24];
  char local_150 [24];
  QObject local_138 [8];
  QObject local_130 [8];
  char local_128 [24];
  char local_110 [24];
  char local_f8 [24];
  char local_e0 [24];
  QObject local_c8 [40];
  char local_a0 [24];
  char local_88 [24];
  QObject local_70 [8];
  char local_68 [24];
  char local_50 [24];
  char local_38 [24];
  char local_20 [24];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = (QObject *)q_func(in_RDI);
  pQVar3 = (QActionGroup *)operator_new(0x10);
  QActionGroup::QActionGroup(pQVar3,pQVar2);
  in_RDI->navGroup = pQVar3;
  QActionGroup::setExclusive(SUB81(in_RDI->navGroup,0));
  pQVar3 = in_RDI->navGroup;
  QCoreApplication::translate(local_20,"QPrintPreviewDialog","Next page",0);
  pQVar4 = (QAction *)QActionGroup::addAction((QString *)pQVar3);
  in_RDI->nextPageAction = pQVar4;
  QString::~QString((QString *)0x17c9da);
  this_00 = (QAnyStringView *)in_RDI->navGroup;
  QCoreApplication::translate(local_38,"QPrintPreviewDialog","Previous page",0);
  pQVar4 = (QAction *)QActionGroup::addAction((QString *)this_00);
  in_RDI->prevPageAction = pQVar4;
  QString::~QString((QString *)0x17ca44);
  this_01 = in_RDI->navGroup;
  QCoreApplication::translate(local_50,"QPrintPreviewDialog","First page",0);
  pQVar4 = (QAction *)QActionGroup::addAction((QString *)this_01);
  in_RDI->firstPageAction = pQVar4;
  QString::~QString((QString *)0x17caae);
  pQVar7 = in_RDI->navGroup;
  QCoreApplication::translate(local_68,"QPrintPreviewDialog","Last page",0);
  pQVar4 = (QAction *)QActionGroup::addAction((QString *)pQVar7);
  in_RDI->lastPageAction = pQVar4;
  QString::~QString((QString *)0x17cb18);
  Qt::Literals::StringLiterals::operator____L1((char *)this_00,(size_t)pQVar3);
  name.m_data = in_stack_fffffffffffffcd8;
  name.m_size = in_stack_fffffffffffffcd0;
  qt_setupActionIcon(in_stack_fffffffffffffbc8,name);
  Qt::Literals::StringLiterals::operator____L1((char *)this_00,(size_t)pQVar3);
  name_00.m_data = in_stack_fffffffffffffcd8;
  name_00.m_size = in_stack_fffffffffffffcd0;
  qt_setupActionIcon(in_stack_fffffffffffffbc8,name_00);
  Qt::Literals::StringLiterals::operator____L1((char *)this_00,(size_t)pQVar3);
  name_01.m_data = in_stack_fffffffffffffcd8;
  name_01.m_size = in_stack_fffffffffffffcd0;
  qt_setupActionIcon(in_stack_fffffffffffffbc8,name_01);
  Qt::Literals::StringLiterals::operator____L1((char *)this_00,(size_t)pQVar3);
  name_02.m_data = in_stack_fffffffffffffcd8;
  name_02.m_size = in_stack_fffffffffffffcd0;
  qt_setupActionIcon(in_stack_fffffffffffffbc8,name_02);
  QObject::connect(local_70,(char *)in_RDI->navGroup,(QObject *)"2triggered(QAction*)",
                   (char *)pQVar2,0x18e7b5);
  QMetaObject::Connection::~Connection((Connection *)local_70);
  pQVar5 = (QActionGroup *)operator_new(0x10);
  QActionGroup::QActionGroup(pQVar5,pQVar2);
  in_RDI->fitGroup = pQVar5;
  pQVar5 = in_RDI->fitGroup;
  QCoreApplication::translate(local_88,"QPrintPreviewDialog","Fit width",0);
  pQVar4 = (QAction *)QActionGroup::addAction((QString *)pQVar5);
  in_RDI->fitWidthAction = pQVar4;
  QString::~QString((QString *)0x17cd2b);
  pQVar5 = in_RDI->fitGroup;
  QCoreApplication::translate(local_a0,"QPrintPreviewDialog","Fit page",0);
  pQVar4 = (QAction *)QActionGroup::addAction((QString *)pQVar5);
  in_RDI->fitPageAction = pQVar4;
  QString::~QString((QString *)0x17cd95);
  pQVar4 = in_RDI->fitWidthAction;
  Qt::Literals::StringLiterals::operator____L1((char *)this_00,(size_t)pQVar3);
  QVar8.m_data = (char *)pQVar7;
  QVar8.m_size = (qsizetype)this_01;
  QAnyStringView::QAnyStringView(this_00,QVar8);
  QObject::setObjectName((QAnyStringView *)pQVar4);
  pQVar6 = in_RDI->fitPageAction;
  Qt::Literals::StringLiterals::operator____L1((char *)this_00,(size_t)pQVar3);
  str.m_data = (char *)pQVar7;
  str.m_size = (qsizetype)this_01;
  QAnyStringView::QAnyStringView(this_00,str);
  QObject::setObjectName((QAnyStringView *)pQVar6);
  QAction::setCheckable(SUB81(in_RDI->fitWidthAction,0));
  QAction::setCheckable(SUB81(in_RDI->fitPageAction,0));
  Qt::Literals::StringLiterals::operator____L1((char *)this_00,(size_t)pQVar3);
  name_03.m_data = in_stack_fffffffffffffcd8;
  name_03.m_size = in_stack_fffffffffffffcd0;
  qt_setupActionIcon(pQVar4,name_03);
  Qt::Literals::StringLiterals::operator____L1((char *)this_00,(size_t)pQVar3);
  name_04.m_data = in_stack_fffffffffffffcd8;
  name_04.m_size = in_stack_fffffffffffffcd0;
  qt_setupActionIcon(pQVar4,name_04);
  QObject::connect(local_c8,(char *)in_RDI->fitGroup,(QObject *)"2triggered(QAction*)",
                   (char *)pQVar2,0x18e819);
  QMetaObject::Connection::~Connection((Connection *)local_c8);
  pQVar5 = (QActionGroup *)operator_new(0x10);
  QActionGroup::QActionGroup(pQVar5,pQVar2);
  in_RDI->zoomGroup = pQVar5;
  pQVar5 = in_RDI->zoomGroup;
  QCoreApplication::translate(local_e0,"QPrintPreviewDialog","Zoom in",0);
  pQVar6 = (QAction *)QActionGroup::addAction((QString *)pQVar5);
  in_RDI->zoomInAction = pQVar6;
  QString::~QString((QString *)0x17d020);
  pQVar5 = in_RDI->zoomGroup;
  QCoreApplication::translate(local_f8,"QPrintPreviewDialog","Zoom out",0);
  pQVar6 = (QAction *)QActionGroup::addAction((QString *)pQVar5);
  in_RDI->zoomOutAction = pQVar6;
  QString::~QString((QString *)0x17d090);
  Qt::Literals::StringLiterals::operator____L1((char *)this_00,(size_t)pQVar3);
  name_05.m_data = in_stack_fffffffffffffcd8;
  name_05.m_size = in_stack_fffffffffffffcd0;
  qt_setupActionIcon(pQVar4,name_05);
  Qt::Literals::StringLiterals::operator____L1((char *)this_00,(size_t)pQVar3);
  name_06.m_data = in_stack_fffffffffffffcd8;
  name_06.m_size = in_stack_fffffffffffffcd0;
  qt_setupActionIcon(pQVar4,name_06);
  pQVar5 = (QActionGroup *)operator_new(0x10);
  QActionGroup::QActionGroup(pQVar5,pQVar2);
  in_RDI->orientationGroup = pQVar5;
  pQVar5 = in_RDI->orientationGroup;
  QCoreApplication::translate(local_110,"QPrintPreviewDialog","Portrait",0);
  pQVar6 = (QAction *)QActionGroup::addAction((QString *)pQVar5);
  in_RDI->portraitAction = pQVar6;
  QString::~QString((QString *)0x17d1db);
  pQVar5 = in_RDI->orientationGroup;
  QCoreApplication::translate(local_128,"QPrintPreviewDialog","Landscape",0);
  pQVar6 = (QAction *)QActionGroup::addAction((QString *)pQVar5);
  in_RDI->landscapeAction = pQVar6;
  QString::~QString((QString *)0x17d24b);
  QAction::setCheckable(SUB81(in_RDI->portraitAction,0));
  QAction::setCheckable(SUB81(in_RDI->landscapeAction,0));
  Qt::Literals::StringLiterals::operator____L1((char *)this_00,(size_t)pQVar3);
  name_07.m_data = in_stack_fffffffffffffcd8;
  name_07.m_size = in_stack_fffffffffffffcd0;
  qt_setupActionIcon(pQVar4,name_07);
  Qt::Literals::StringLiterals::operator____L1((char *)this_00,(size_t)pQVar3);
  name_08.m_data = in_stack_fffffffffffffcd8;
  name_08.m_size = in_stack_fffffffffffffcd0;
  qt_setupActionIcon(pQVar4,name_08);
  QObject::connect(local_130,(char *)in_RDI->portraitAction,(QObject *)"2triggered(bool)",
                   (char *)in_RDI->preview,0x18e87f);
  QMetaObject::Connection::~Connection((Connection *)local_130);
  QObject::connect(local_138,(char *)in_RDI->landscapeAction,(QObject *)"2triggered(bool)",
                   (char *)in_RDI->preview,0x18e899);
  QMetaObject::Connection::~Connection((Connection *)local_138);
  pQVar5 = (QActionGroup *)operator_new(0x10);
  QActionGroup::QActionGroup(pQVar5,pQVar2);
  in_RDI->modeGroup = pQVar5;
  pQVar5 = in_RDI->modeGroup;
  QCoreApplication::translate(local_150,"QPrintPreviewDialog","Show single page",0);
  pQVar6 = (QAction *)QActionGroup::addAction((QString *)pQVar5);
  in_RDI->singleModeAction = pQVar6;
  QString::~QString((QString *)0x17d44a);
  pQVar5 = in_RDI->modeGroup;
  QCoreApplication::translate(local_168,"QPrintPreviewDialog","Show facing pages",0);
  pQVar6 = (QAction *)QActionGroup::addAction((QString *)pQVar5);
  in_RDI->facingModeAction = pQVar6;
  QString::~QString((QString *)0x17d4ba);
  pQVar5 = in_RDI->modeGroup;
  QCoreApplication::translate(local_180,"QPrintPreviewDialog","Show overview of all pages",0);
  pQVar6 = (QAction *)QActionGroup::addAction((QString *)pQVar5);
  in_RDI->overviewModeAction = pQVar6;
  QString::~QString((QString *)0x17d52a);
  Qt::Literals::StringLiterals::operator____L1((char *)this_00,(size_t)pQVar3);
  name_09.m_data = in_stack_fffffffffffffcd8;
  name_09.m_size = in_stack_fffffffffffffcd0;
  qt_setupActionIcon(pQVar4,name_09);
  Qt::Literals::StringLiterals::operator____L1((char *)this_00,(size_t)pQVar3);
  name_10.m_data = in_stack_fffffffffffffcd8;
  name_10.m_size = in_stack_fffffffffffffcd0;
  qt_setupActionIcon(pQVar4,name_10);
  Qt::Literals::StringLiterals::operator____L1((char *)this_00,(size_t)pQVar3);
  name_11.m_data = in_stack_fffffffffffffcd8;
  name_11.m_size = in_stack_fffffffffffffcd0;
  qt_setupActionIcon(pQVar4,name_11);
  pQVar6 = in_RDI->singleModeAction;
  Qt::Literals::StringLiterals::operator____L1((char *)this_00,(size_t)pQVar3);
  str_00.m_data = (char *)pQVar7;
  str_00.m_size = (qsizetype)this_01;
  QAnyStringView::QAnyStringView(this_00,str_00);
  QObject::setObjectName((QAnyStringView *)pQVar6);
  pQVar6 = in_RDI->facingModeAction;
  Qt::Literals::StringLiterals::operator____L1((char *)this_00,(size_t)pQVar3);
  str_01.m_data = (char *)pQVar7;
  str_01.m_size = (qsizetype)this_01;
  QAnyStringView::QAnyStringView(this_00,str_01);
  QObject::setObjectName((QAnyStringView *)pQVar6);
  pQVar6 = in_RDI->overviewModeAction;
  QVar8 = Qt::Literals::StringLiterals::operator____L1((char *)this_00,(size_t)pQVar3);
  pcVar10 = (char *)QVar8.m_size;
  str_02.m_data = (char *)pQVar7;
  str_02.m_size = (qsizetype)this_01;
  QAnyStringView::QAnyStringView(this_00,str_02);
  QObject::setObjectName((QAnyStringView *)pQVar6);
  QAction::setCheckable(SUB81(in_RDI->singleModeAction,0));
  QAction::setCheckable(SUB81(in_RDI->facingModeAction,0));
  QAction::setCheckable(SUB81(in_RDI->overviewModeAction,0));
  QObject::connect(local_1b8,(char *)in_RDI->modeGroup,(QObject *)"2triggered(QAction*)",
                   (char *)pQVar2,0x18e95f);
  QMetaObject::Connection::~Connection((Connection *)local_1b8);
  pQVar7 = (QActionGroup *)operator_new(0x10);
  QActionGroup::QActionGroup(pQVar7,pQVar2);
  in_RDI->printerGroup = pQVar7;
  pQVar7 = in_RDI->printerGroup;
  QCoreApplication::translate(local_1d0,"QPrintPreviewDialog","Print",0);
  pQVar6 = (QAction *)QActionGroup::addAction((QString *)pQVar7);
  in_RDI->printAction = pQVar6;
  QString::~QString((QString *)0x17d8ad);
  pQVar7 = in_RDI->printerGroup;
  QCoreApplication::translate(local_1e8,"QPrintPreviewDialog","Page setup",0);
  pQVar6 = (QAction *)QActionGroup::addAction((QString *)pQVar7);
  in_RDI->pageSetupAction = pQVar6;
  QString::~QString((QString *)0x17d91d);
  QVar8 = Qt::Literals::StringLiterals::operator____L1((char *)this_00,(size_t)pQVar3);
  pcVar9 = QVar8.m_data;
  name_12.m_data = pcVar10;
  name_12.m_size = (qsizetype)pcVar9;
  qt_setupActionIcon(pQVar4,name_12);
  Qt::Literals::StringLiterals::operator____L1((char *)this_00,(size_t)pQVar3);
  name_13.m_data = pcVar10;
  name_13.m_size = (qsizetype)pcVar9;
  qt_setupActionIcon(pQVar4,name_13);
  QObject::connect(local_1f0,(char *)in_RDI->printAction,(QObject *)"2triggered(bool)",
                   (char *)pQVar2,0x18e993);
  QMetaObject::Connection::~Connection((Connection *)local_1f0);
  QObject::connect(local_1f8,(char *)in_RDI->pageSetupAction,(QObject *)"2triggered(bool)",
                   (char *)pQVar2,0x18e99f);
  QMetaObject::Connection::~Connection((Connection *)local_1f8);
  QAction::setChecked(SUB81(in_RDI->fitPageAction,0));
  QAction::setChecked(SUB81(in_RDI->singleModeAction,0));
  OVar1 = QPrintPreviewWidget::orientation((QPrintPreviewWidget *)this_01);
  if (OVar1 == Portrait) {
    QAction::setChecked(SUB81(in_RDI->portraitAction,0));
  }
  else {
    QAction::setChecked(SUB81(in_RDI->landscapeAction,0));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QPrintPreviewDialogPrivate::setupActions()
{
    Q_Q(QPrintPreviewDialog);

    // Navigation
    navGroup = new QActionGroup(q);
    navGroup->setExclusive(false);
    nextPageAction = navGroup->addAction(QCoreApplication::translate("QPrintPreviewDialog", "Next page"));
    prevPageAction = navGroup->addAction(QCoreApplication::translate("QPrintPreviewDialog", "Previous page"));
    firstPageAction = navGroup->addAction(QCoreApplication::translate("QPrintPreviewDialog", "First page"));
    lastPageAction = navGroup->addAction(QCoreApplication::translate("QPrintPreviewDialog", "Last page"));
    qt_setupActionIcon(nextPageAction, "go-next"_L1);
    qt_setupActionIcon(prevPageAction, "go-previous"_L1);
    qt_setupActionIcon(firstPageAction, "go-first"_L1);
    qt_setupActionIcon(lastPageAction, "go-last"_L1);
    QObject::connect(navGroup, SIGNAL(triggered(QAction*)), q, SLOT(_q_navigate(QAction*)));


    fitGroup = new QActionGroup(q);
    fitWidthAction = fitGroup->addAction(QCoreApplication::translate("QPrintPreviewDialog", "Fit width"));
    fitPageAction = fitGroup->addAction(QCoreApplication::translate("QPrintPreviewDialog", "Fit page"));
    fitWidthAction->setObjectName("fitWidthAction"_L1);
    fitPageAction->setObjectName("fitPageAction"_L1);
    fitWidthAction->setCheckable(true);
    fitPageAction->setCheckable(true);
    qt_setupActionIcon(fitWidthAction, "zoom-fit-width"_L1);
    qt_setupActionIcon(fitPageAction, "zoom-fit-page"_L1);
    QObject::connect(fitGroup, SIGNAL(triggered(QAction*)), q, SLOT(_q_fit(QAction*)));

    // Zoom
    zoomGroup = new QActionGroup(q);
    zoomInAction = zoomGroup->addAction(QCoreApplication::translate("QPrintPreviewDialog", "Zoom in"));
    zoomOutAction = zoomGroup->addAction(QCoreApplication::translate("QPrintPreviewDialog", "Zoom out"));
    qt_setupActionIcon(zoomInAction, "zoom-in"_L1);
    qt_setupActionIcon(zoomOutAction, "zoom-out"_L1);

    // Portrait/Landscape
    orientationGroup = new QActionGroup(q);
    portraitAction = orientationGroup->addAction(QCoreApplication::translate("QPrintPreviewDialog", "Portrait"));
    landscapeAction = orientationGroup->addAction(QCoreApplication::translate("QPrintPreviewDialog", "Landscape"));
    portraitAction->setCheckable(true);
    landscapeAction->setCheckable(true);
    qt_setupActionIcon(portraitAction, "layout-portrait"_L1);
    qt_setupActionIcon(landscapeAction, "layout-landscape"_L1);
    QObject::connect(portraitAction, SIGNAL(triggered(bool)), preview, SLOT(setPortraitOrientation()));
    QObject::connect(landscapeAction, SIGNAL(triggered(bool)), preview, SLOT(setLandscapeOrientation()));

    // Display mode
    modeGroup = new QActionGroup(q);
    singleModeAction = modeGroup->addAction(QCoreApplication::translate("QPrintPreviewDialog", "Show single page"));
    facingModeAction = modeGroup->addAction(QCoreApplication::translate("QPrintPreviewDialog", "Show facing pages"));
    overviewModeAction = modeGroup->addAction(QCoreApplication::translate("QPrintPreviewDialog", "Show overview of all pages"));
    qt_setupActionIcon(singleModeAction, "view-pages-single"_L1);
    qt_setupActionIcon(facingModeAction, "view-pages-facing"_L1);
    qt_setupActionIcon(overviewModeAction, "view-pages-overview"_L1);
    singleModeAction->setObjectName("singleModeAction"_L1);
    facingModeAction->setObjectName("facingModeAction"_L1);
    overviewModeAction->setObjectName("overviewModeAction"_L1);

    singleModeAction->setCheckable(true);
    facingModeAction->setCheckable(true);
    overviewModeAction->setCheckable(true);
    QObject::connect(modeGroup, SIGNAL(triggered(QAction*)), q, SLOT(_q_setMode(QAction*)));

    // Print
    printerGroup = new QActionGroup(q);
    printAction = printerGroup->addAction(QCoreApplication::translate("QPrintPreviewDialog", "Print"));
    pageSetupAction = printerGroup->addAction(QCoreApplication::translate("QPrintPreviewDialog", "Page setup"));
    qt_setupActionIcon(printAction, "printer"_L1);
    qt_setupActionIcon(pageSetupAction, "page-setup"_L1);
    QObject::connect(printAction, SIGNAL(triggered(bool)), q, SLOT(_q_print()));
    QObject::connect(pageSetupAction, SIGNAL(triggered(bool)), q, SLOT(_q_pageSetup()));

    // Initial state:
    fitPageAction->setChecked(true);
    singleModeAction->setChecked(true);
    if (preview->orientation() == QPageLayout::Portrait)
        portraitAction->setChecked(true);
    else
        landscapeAction->setChecked(true);
}